

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

void nullcTerminate(void)

{
  Linker *pLVar1;
  ExecutorX86 *pEVar2;
  ExecutorRegVm *pEVar3;
  CompilerContext *pCVar4;
  
  pCVar4 = NULLC::compilerCtx;
  NULLC::nullcLastError = "";
  if (NULLC::initialized == '\x01') {
    if (NULLC::compilerCtx != (CompilerContext *)0x0) {
      CompilerContext::~CompilerContext(NULLC::compilerCtx);
      (*(code *)NULLC::dealloc)(pCVar4);
    }
    NULLC::compilerCtx = (CompilerContext *)0x0;
    GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Reset
              ((GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *)NULLC::allocator);
    (*(code *)NULLC::dealloc)(NULLC::argBuf);
    NULLC::argBuf = 0;
    (*(code *)NULLC::dealloc)(NULLC::errorBuf);
    NULLC::errorBuf = 0;
    (*(code *)NULLC::dealloc)(NULLC::outputBuf);
    NULLC::outputBuf = 0;
    (*(code *)NULLC::dealloc)(NULLC::tempOutputBuf);
    NULLC::tempOutputBuf = 0;
    BinaryCache::Terminate();
    nullcDeinitTypeinfoModule();
    nullcDeinitDynamicModule();
    pLVar1 = NULLC::linker;
    if (NULLC::linker != (Linker *)0x0) {
      Linker::~Linker(NULLC::linker);
      (*(code *)NULLC::dealloc)(pLVar1);
    }
    pEVar2 = NULLC::executorX86;
    NULLC::linker = (Linker *)0x0;
    if (NULLC::executorX86 != (ExecutorX86 *)0x0) {
      ExecutorX86::~ExecutorX86(NULLC::executorX86);
      (*(code *)NULLC::dealloc)(pEVar2);
    }
    pEVar3 = NULLC::executorRegVm;
    NULLC::executorX86 = (ExecutorX86 *)0x0;
    if (NULLC::executorRegVm != (ExecutorRegVm *)0x0) {
      ExecutorRegVm::~ExecutorRegVm(NULLC::executorRegVm);
      (*(code *)NULLC::dealloc)(pEVar3);
    }
    NULLC::executorRegVm = (ExecutorRegVm *)0x0;
    NULLC::ResetMemory();
    NULLC::initialized = '\0';
  }
  return;
}

Assistant:

void nullcTerminate()
{
	using namespace NULLC;
	nullcLastError = "";
	if(!initialized)
		return;

	NULLC::destruct(compilerCtx);
	compilerCtx = NULL;

	allocator.Reset();

	NULLC::dealloc(argBuf);
	argBuf = NULL;

	NULLC::dealloc(errorBuf);
	errorBuf = NULL;

	NULLC::dealloc(outputBuf);
	outputBuf = NULL;

	NULLC::dealloc(tempOutputBuf);
	tempOutputBuf = NULL;

	BinaryCache::Terminate();

#ifndef NULLC_NO_EXECUTOR
	nullcDeinitTypeinfoModule();
	nullcDeinitDynamicModule();

	NULLC::destruct(linker);
	linker = NULL;
#endif
#ifdef NULLC_BUILD_X86_JIT
	NULLC::destruct(executorX86);
	executorX86 = NULL;
#endif
#ifndef NULLC_NO_EXECUTOR
	NULLC::destruct(executorRegVm);
	executorRegVm = NULL;
#endif

#ifndef NULLC_NO_EXECUTOR
	NULLC::ResetMemory();
#endif

	initialized = false;
}